

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

void __thiscall
double_conversion::DoubleToStringConverter::CreateExponentialRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int exponent,
          StringBuilder *result_builder)

{
  int n;
  int *piVar1;
  int in_ECX;
  int in_EDX;
  uint *in_RDI;
  int first_char_pos;
  char buffer [6];
  int kMaxExponentLength;
  char in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd4;
  int local_24 [3];
  int local_18;
  int local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  StringBuilder::AddCharacter
            ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbf);
  if (local_14 != 1) {
    StringBuilder::AddCharacter
              ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbf);
    StringBuilder::AddSubstring
              ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)in_RDI,in_stack_ffffffffffffffc4);
  }
  StringBuilder::AddCharacter
            ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbf);
  if (local_18 < 0) {
    StringBuilder::AddCharacter
              ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbf);
    local_18 = -local_18;
  }
  else if ((*in_RDI & 1) != 0) {
    StringBuilder::AddCharacter
              ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbf);
  }
  if (local_18 == 0) {
    StringBuilder::AddCharacter
              ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbf);
  }
  else {
    local_24[0] = 5;
    iVar2 = 5;
    for (; 0 < local_18; local_18 = local_18 / 10) {
      iVar2 = iVar2 + -1;
      (&stack0xffffffffffffffd6)[iVar2] = (char)(local_18 % 10) + '0';
    }
    while( true ) {
      n = 5 - iVar2;
      piVar1 = std::min<int>((int *)(in_RDI + 0xb),local_24);
      if (*piVar1 <= n) break;
      iVar2 = iVar2 + -1;
      (&stack0xffffffffffffffd6)[iVar2] = 0x30;
    }
    StringBuilder::AddSubstring
              ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),(char *)in_RDI,n);
  }
  return;
}

Assistant:

void DoubleToStringConverter::CreateExponentialRepresentation(
    const char* decimal_digits,
    int length,
    int exponent,
    StringBuilder* result_builder) const {
  DOUBLE_CONVERSION_ASSERT(length != 0);
  result_builder->AddCharacter(decimal_digits[0]);
  if (length != 1) {
    result_builder->AddCharacter('.');
    result_builder->AddSubstring(&decimal_digits[1], length-1);
  }
  result_builder->AddCharacter(exponent_character_);
  if (exponent < 0) {
    result_builder->AddCharacter('-');
    exponent = -exponent;
  } else {
    if ((flags_ & EMIT_POSITIVE_EXPONENT_SIGN) != 0) {
      result_builder->AddCharacter('+');
    }
  }
  if (exponent == 0) {
    result_builder->AddCharacter('0');
    return;
  }
  DOUBLE_CONVERSION_ASSERT(exponent < 1e4);
  // Changing this constant requires updating the comment of DoubleToStringConverter constructor
  const int kMaxExponentLength = 5;
  char buffer[kMaxExponentLength + 1];
  buffer[kMaxExponentLength] = '\0';
  int first_char_pos = kMaxExponentLength;
  while (exponent > 0) {
    buffer[--first_char_pos] = '0' + (exponent % 10);
    exponent /= 10;
  }
  // Add prefix '0' to make exponent width >= min(min_exponent_with_, kMaxExponentLength)
  // For example: convert 1e+9 -> 1e+09, if min_exponent_with_ is set to 2
  while(kMaxExponentLength - first_char_pos < std::min(min_exponent_width_, kMaxExponentLength)) {
    buffer[--first_char_pos] = '0';
  }
  result_builder->AddSubstring(&buffer[first_char_pos],
                               kMaxExponentLength - first_char_pos);
}